

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O0

vector<signed_char,_std::allocator<signed_char>_> *
baryonyx::make_variable_value<baryonyx::raw_problem>
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,raw_problem *pb
          ,result *r)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  mapped_type *pmVar7;
  const_reference pvVar8;
  pointer ppVar9;
  byte *pbVar10;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_true>
  local_b0;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_true>
  local_a8;
  iterator it;
  size_t e_2;
  size_t i_2;
  size_type local_88;
  size_t e_1;
  size_t i_1;
  size_type local_68;
  size_t e;
  size_t i;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
  cache;
  result *r_local;
  raw_problem *pb_local;
  vector<signed_char,_std::allocator<signed_char>_> *ret;
  
  cache._M_h._M_single_bucket = (__node_base_ptr)r;
  bVar2 = result::operator_cast_to_bool(r);
  if ((!bVar2) ||
     (bVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::empty
                        ((vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                         (cache._M_h._M_single_bucket + 0xd)), bVar2)) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<signed_char,_std::allocator<signed_char>_>::vector(__return_storage_ptr__);
  }
  else {
    std::
    unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
    ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                     *)&i);
    sVar3 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)(cache._M_h._M_single_bucket + 4));
    sVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)
                       (cache._M_h._M_single_bucket + 7));
    if (sVar3 != sVar4) {
      details::fail_fast("Postcondition",
                         "r.affected_vars.names.size() == r.affected_vars.values.size()",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                         ,"212");
    }
    e = 0;
    local_68 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)(cache._M_h._M_single_bucket + 4));
    for (; e != local_68; e = e + 1) {
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)
                          (cache._M_h._M_single_bucket + 7),e);
      cVar1 = *pvVar5;
      pvVar6 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)(cache._M_h._M_single_bucket + 4),e);
      pmVar7 = std::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
               ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                             *)&i,pvVar6);
      *pmVar7 = cVar1 != '\0';
    }
    sVar3 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)(cache._M_h._M_single_bucket + 10));
    pvVar8 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                       ((vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                        (cache._M_h._M_single_bucket + 0xd));
    sVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar8->variables);
    if (sVar3 != sVar4) {
      details::fail_fast("Postcondition",
                         "r.variable_name.size() == r.solutions.back().variables.size()",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                         ,"217");
    }
    e_1 = 0;
    local_88 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)(cache._M_h._M_single_bucket + 10));
    for (; e_1 != local_88; e_1 = e_1 + 1) {
      pvVar8 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                         ((vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                          (cache._M_h._M_single_bucket + 0xd));
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&pvVar8->variables,e_1);
      cVar1 = *pvVar5;
      pvVar6 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)(cache._M_h._M_single_bucket + 10),e_1);
      pmVar7 = std::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
               ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                             *)&i,pvVar6);
      *pmVar7 = cVar1 != '\0';
    }
    i_2._7_1_ = 0;
    sVar3 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size(&(pb->vars).names);
    i_2._6_1_ = 0;
    std::allocator<signed_char>::allocator((allocator<signed_char> *)((long)&i_2 + 5));
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              (__return_storage_ptr__,sVar3,(value_type_conflict *)((long)&i_2 + 6),
               (allocator<signed_char> *)((long)&i_2 + 5));
    std::allocator<signed_char>::~allocator((allocator<signed_char> *)((long)&i_2 + 5));
    e_2 = 0;
    it.
    super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_true>
               )std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::size(&(pb->vars).names);
    for (; (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_true>
            )e_2 != it.
                    super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_true>
                    ._M_cur; e_2 = e_2 + 1) {
      pvVar6 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&(pb->vars).names,e_2);
      local_a8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
           ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                   *)&i,pvVar6);
      local_b0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
           ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                  *)&i);
      bVar2 = std::__detail::operator==(&local_a8,&local_b0);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        details::fail_fast("Precondition","it != cache.end()",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                           ,"226");
      }
      ppVar9 = std::__detail::
               _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>,_false,_true>
                             *)&local_a8);
      bVar2 = ppVar9->second;
      pbVar10 = (byte *)std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                  (__return_storage_ptr__,e_2);
      *pbVar10 = bVar2 & 1;
    }
    i_2._7_1_ = 1;
    std::
    unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
    ::~unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                      *)&i);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<var_value>
make_variable_value(const Problem& pb, const result& r)
{
    if (!r || r.solutions.empty())
        return {};

    std::unordered_map<std::string_view, bool> cache;

    bx_ensures(r.affected_vars.names.size() == r.affected_vars.values.size());

    for (size_t i = 0, e = r.affected_vars.names.size(); i != e; ++i)
        cache[r.affected_vars.names[i]] = r.affected_vars.values[i];

    bx_ensures(r.variable_name.size() == r.solutions.back().variables.size());

    for (size_t i = 0, e = r.variable_name.size(); i != e; ++i)
        cache[r.variable_name[i]] = r.solutions.back().variables[i];

    std::vector<var_value> ret(pb.vars.names.size(), false);

    for (std::size_t i = 0, e = pb.vars.names.size(); i != e; ++i) {
        auto it = cache.find(pb.vars.names[i]);
        bx_expects(it != cache.end());
        ret[i] = it->second;
    }

    return ret;
}